

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O3

void __thiscall FParser::NextToken(FParser *this)

{
  int iVar1;
  byte bVar2;
  size_t sVar3;
  DFsSection *pDVar4;
  long lVar5;
  tokentype_t tVar6;
  byte *brace;
  char *pcVar7;
  
  iVar1 = this->NumTokens;
  pcVar7 = this->Tokens[(long)iVar1 + -1];
  if ((*pcVar7 != '\0') || (this->TokenType[(long)iVar1 + -1] == string_)) {
    this->NumTokens = iVar1 + 1;
    sVar3 = strlen(pcVar7);
    this->Tokens[iVar1] = pcVar7 + sVar3 + 1;
    pcVar7[sVar3 + 1] = '\0';
  }
  brace = (byte *)this->Rover;
  bVar2 = *brace;
  if (bVar2 == 0) {
LAB_0050ecf0:
    if (*this->Tokens[0] == '\0') {
      return;
    }
    pcVar7 = "missing \';\'\n";
  }
  else {
    if (bVar2 == 0x20) goto LAB_0050ec70;
    if ((char)bVar2 < ' ') {
      do {
        if (bVar2 == 0) break;
LAB_0050ec70:
        brace = brace + 1;
        this->Rover = (char *)brace;
        bVar2 = *brace;
      } while ((char)bVar2 < '!');
      if (bVar2 == 0) goto LAB_0050ecf0;
    }
    iVar1 = this->NumTokens;
    lVar5 = (long)iVar1;
    if (bVar2 == 0x28 && 1 < lVar5) {
      bVar2 = 0x28;
      if (this->TokenType[iVar1 - 2U] != name_) goto LAB_0050ecb0;
      this->TokenType[iVar1 - 2U] = function;
      bVar2 = *brace;
    }
    if (bVar2 < 0x7b) {
      if (bVar2 == 0x22) {
        this->TokenType[lVar5 + -1] = string_;
        if (this->TokenType[lVar5 + -2] == string_) {
          this->NumTokens = iVar1 + -1;
        }
        this->Rover = (char *)(brace + 1);
        return;
      }
      if (bVar2 == 0x3a) {
        this->NumTokens = 1;
        *this->Tokens[0] = '\0';
        this->TokenType[(long)this->NumTokens + -1] = name_;
        this->Rover = this->Rover + 1;
        return;
      }
LAB_0050ecb0:
      if ((((bVar2 == 0x5f) || (0xfffffff5 < (int)(char)bVar2 - 0x3aU)) ||
          (tVar6 = operator_, 0xffffffe5 < ((int)(char)bVar2 & 0xffffffdfU) - 0x5b)) &&
         (tVar6 = number, 9 < (byte)(bVar2 - 0x30))) {
        tVar6 = (tokentype_t)(bVar2 == 0x2e);
      }
      this->TokenType[lVar5 + -1] = tVar6;
      return;
    }
    if (bVar2 == 0x7d) {
      this->BraceType = 1;
      pDVar4 = DFsScript::FindSectionEnd(this->Script,(char *)brace);
    }
    else {
      if (bVar2 != 0x7b) goto LAB_0050ecb0;
      this->BraceType = 0;
      pDVar4 = DFsScript::FindSectionStart(this->Script,(char *)brace);
    }
    this->Section = pDVar4;
    if (pDVar4 != (DFsSection *)0x0) {
      return;
    }
    pcVar7 = "section not found!\n";
  }
  script_error(pcVar7);
  return;
}

Assistant:

void FParser::NextToken()
{
	if(Tokens[NumTokens-1][0] || TokenType[NumTokens-1]==string_)
    {
		NumTokens++;
		Tokens[NumTokens-1] = Tokens[NumTokens-2] + strlen(Tokens[NumTokens-2]) + 1;
		Tokens[NumTokens-1][0] = 0;
    }
	
	// get to the next token, ignoring spaces, newlines,
	// useless chars, comments etc
	
	while(1)
    {
		// empty whitespace
		if(*Rover && (*Rover==' ' || *Rover<32))
		{
			while((*Rover==' ' || *Rover<32) && *Rover) Rover++;
		}
		// end-of-script?
		if(!*Rover)
		{
			if(Tokens[0][0])
			{
				// line contains text, but no semicolon: an error
				script_error("missing ';'\n");
			}
			// empty line, end of command-list
			return;
		}
		break;  // otherwise
    }
	
	if(NumTokens>1 && *Rover == '(' && TokenType[NumTokens-2] == name_)
		TokenType[NumTokens-2] = function;
	
	if(*Rover == '{' || *Rover == '}')
    {
		if(*Rover == '{')
		{
			BraceType = bracket_open;
			Section = Script->FindSectionStart(Rover);
		}
		else            // closing brace
		{
			BraceType = bracket_close;
			Section = Script->FindSectionEnd(Rover);
		}
		if(!Section)
		{
			script_error("section not found!\n");
			return;
		}
    }
	else if(*Rover == ':')  // label
    {
		// ignore the label : reset
		NumTokens = 1;
		Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
		Rover++;        // ignore
    }
	else if(*Rover == '\"')
    {
		TokenType[NumTokens-1] = string_;
		if(TokenType[NumTokens-2] == string_) NumTokens--;   // join strings
		Rover++;
    }
	else
    {
		TokenType[NumTokens-1] = isop(*Rover) ? operator_ : isnum(*Rover) ? number : name_;
    }
}